

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gemm_x86_avx.cpp
# Opt level: O1

int ncnn::gemm_x86(Mat *A,Mat *B,Mat *C,Mat *top_blob,int broadcast_type_C,int transA,int transB,
                  int output_transpose,int constant_TILE_M,int constant_TILE_N,int constant_TILE_K,
                  int nT,Option *opt)

{
  int max_kk;
  int *piVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  ulong uVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  long lVar11;
  Allocator *pAVar12;
  int iVar13;
  ulong uVar14;
  void *pvVar15;
  int iVar16;
  Mat *pMVar17;
  ulong uVar18;
  int TILE_K;
  byte local_26d;
  int TILE_N;
  int local_268;
  int local_264;
  Mat *local_260;
  int local_254;
  Mat *local_250;
  ulong local_248;
  int local_240;
  int TILE_M;
  Mat local_238;
  ulong local_1e8;
  Mat *local_1e0;
  Mat local_1d8;
  Allocator *local_190;
  long local_188;
  int local_17c;
  Mat local_178;
  Mat *local_128;
  Mat *local_120;
  Mat local_118;
  Mat local_c8;
  Mat local_78;
  
  if (transA == 0) {
    iVar16 = A->elempack * (&A->h)[(ulong)(A->dims == 3) * 2];
    iVar13 = A->w;
  }
  else {
    iVar16 = A->w;
    iVar13 = A->elempack * (&A->h)[(ulong)(A->dims == 3) * 2];
  }
  if (transB == 0) {
    uVar7 = B->w;
  }
  else {
    uVar7 = B->elempack * (&B->h)[(ulong)(B->dims == 3) * 2];
  }
  local_268 = transA;
  local_264 = broadcast_type_C;
  local_260 = B;
  local_1e0 = A;
  local_128 = C;
  local_120 = top_blob;
  get_optimal_tile_mnk
            (iVar16,uVar7,iVar13,constant_TILE_M,constant_TILE_N,constant_TILE_K,&TILE_M,&TILE_N,
             &TILE_K,nT);
  iVar6 = TILE_N;
  iVar5 = TILE_K;
  local_240 = (iVar16 + TILE_M + -1) / TILE_M;
  iVar8 = (int)(uVar7 + TILE_N + -1) / TILE_N;
  iVar9 = (iVar13 + TILE_K + -1) / TILE_K;
  local_118.cstep = 0;
  local_118.data = (void *)0x0;
  local_118.refcount._0_4_ = 0;
  local_118.refcount._4_4_ = 0;
  local_118.elemsize._0_4_ = 0;
  local_118.elemsize._4_4_ = 0;
  local_118.elempack = 0;
  local_118.allocator = (Allocator *)0x0;
  local_118.dims = 0;
  local_118.w = 0;
  local_118.h = 0;
  local_118.d = 0;
  local_118.c = 0;
  local_1e8 = (ulong)uVar7;
  Mat::create(&local_118,TILE_M * TILE_K,iVar9,nT,4,opt->workspace_allocator);
  iVar16 = -100;
  if ((local_118.data == (void *)0x0) || ((long)local_118.c * local_118.cstep == 0))
  goto LAB_0051b8aa;
  local_178.cstep = 0;
  local_178.data = (void *)0x0;
  local_178.refcount._0_4_ = 0;
  local_178.refcount._4_4_ = 0;
  local_178.elemsize._0_4_ = 0;
  local_178.elemsize._4_4_ = 0;
  local_178.elempack = 0;
  local_178.allocator = (Allocator *)0x0;
  local_178.dims = 0;
  local_178.w = 0;
  local_178.h = 0;
  local_178.d = 0;
  local_178.c = 0;
  Mat::create(&local_178,iVar5 * iVar6,iVar9,iVar8,4,opt->workspace_allocator);
  pMVar17 = local_260;
  iVar16 = -100;
  if ((local_178.data != (void *)0x0) && ((long)local_178.c * local_178.cstep != 0)) {
    iVar8 = iVar9 * iVar8;
    if (0 < iVar8) {
      iVar16 = 0;
      do {
        iVar6 = TILE_N * (iVar16 / iVar9);
        iVar10 = TILE_K * (int)((long)iVar16 % (long)iVar9);
        iVar5 = (int)local_1e8 - iVar6;
        if (TILE_N < iVar5) {
          iVar5 = TILE_N;
        }
        max_kk = iVar13 - iVar10;
        if (TILE_K < iVar13 - iVar10) {
          max_kk = TILE_K;
        }
        local_238.cstep = (size_t)local_178.w;
        local_238.data =
             (void *)((long)local_178.data +
                     ((long)iVar16 % (long)iVar9 & 0xffffffffU) * local_238.cstep *
                     CONCAT44(local_178.elemsize._4_4_,(undefined4)local_178.elemsize) +
                     (long)(iVar16 / iVar9) * local_178.cstep *
                     CONCAT44(local_178.elemsize._4_4_,(undefined4)local_178.elemsize));
        local_238.refcount._0_4_ = 0;
        local_238.refcount._4_4_ = 0;
        local_238.elemsize._0_4_ = (undefined4)local_178.elemsize;
        local_238.elemsize._4_4_ = local_178.elemsize._4_4_;
        local_238.elempack = local_178.elempack;
        local_238.allocator = local_178.allocator;
        local_238.dims = 2;
        local_238.w = local_178.w;
        local_238.h = 1;
        local_238.d = 1;
        local_238.c = 1;
        if (transB == 0) {
          transpose_pack_B_tile(pMVar17,&local_238,iVar6,iVar5,iVar10,max_kk);
        }
        else {
          pack_B_tile(pMVar17,&local_238,iVar6,iVar5,iVar10,max_kk);
        }
        piVar1 = (int *)CONCAT44(local_238.refcount._4_4_,local_238.refcount._0_4_);
        if (piVar1 != (int *)0x0) {
          LOCK();
          *piVar1 = *piVar1 + -1;
          UNLOCK();
          if (*piVar1 == 0) {
            if (local_238.allocator == (Allocator *)0x0) {
              if (local_238.data != (void *)0x0) {
                free(local_238.data);
              }
            }
            else {
              (*(local_238.allocator)->_vptr_Allocator[3])();
            }
          }
        }
        iVar16 = iVar16 + 1;
      } while (iVar8 != iVar16);
    }
    pMVar17 = local_1e0;
    local_238.cstep = 0;
    local_238.data = (void *)0x0;
    local_238.refcount._0_4_ = 0;
    local_238.refcount._4_4_ = 0;
    local_238.elemsize._0_4_ = 0;
    local_238.elemsize._4_4_ = 0;
    local_238.elempack = 0;
    local_238.allocator = (Allocator *)0x0;
    local_238.dims = 0;
    local_238.w = 0;
    local_238.h = 0;
    local_238.d = 0;
    local_238.c = 0;
    if (((output_transpose == 0) && (local_264 != 3)) && (iVar13 <= TILE_K)) {
LAB_0051b0fd:
      if (0 < local_240) {
        local_26d = output_transpose == 0;
        iVar16 = 0;
        uVar14 = local_1e8;
        do {
          if (local_268 == 0) {
            iVar13 = pMVar17->elempack * (&pMVar17->h)[(ulong)(pMVar17->dims == 3) * 2];
            iVar5 = pMVar17->w;
          }
          else {
            iVar13 = pMVar17->w;
            iVar5 = pMVar17->elempack * (&pMVar17->h)[(ulong)(pMVar17->dims == 3) * 2];
          }
          local_248 = (ulong)(uint)(TILE_M * iVar16);
          uVar7 = iVar13 - TILE_M * iVar16;
          if (TILE_M < (int)uVar7) {
            uVar7 = TILE_M;
          }
          local_260 = (Mat *)(ulong)uVar7;
          local_1d8.cstep = 0;
          local_1d8.data = (void *)0x0;
          local_1d8.refcount._0_4_ = 0;
          local_1d8.refcount._4_4_ = 0;
          local_1d8.elemsize._0_4_ = 0;
          local_1d8.elemsize._4_4_ = 0;
          local_1d8.elempack = 0;
          local_1d8.h = 0;
          local_1d8.d = 0;
          local_1d8.c = 0;
          local_1d8.allocator = (Allocator *)0x0;
          local_1d8.dims = 0;
          local_1d8.w = 0;
          local_17c = iVar16;
          if (((output_transpose != 0) || (local_264 == 3)) || (TILE_K < iVar5)) {
            iVar6 = get_omp_thread_num();
            iVar13 = local_238.h;
            iVar16 = local_238.dims;
            uVar3 = local_238.elemsize._4_4_;
            uVar2 = (undefined4)local_238.elemsize;
            lVar11 = (long)local_238.w;
            uVar14 = CONCAT44(local_238.elemsize._4_4_,(undefined4)local_238.elemsize);
            pvVar15 = (void *)((long)iVar6 * local_238.cstep * uVar14 + (long)local_238.data);
            uVar4 = uVar14 * local_238.h * lVar11 + 0xf & 0xfffffffffffffff0;
            uVar18 = uVar4 / uVar14;
            if (local_238.dims == 4) {
              uVar18 = local_238.h * lVar11;
            }
            piVar1 = (int *)CONCAT44(local_1d8.refcount._4_4_,local_1d8.refcount._0_4_);
            pAVar12 = local_238.allocator;
            iVar6 = local_238.elempack;
            iVar8 = local_238.w;
            iVar9 = local_238.d;
            if (piVar1 != (int *)0x0) {
              LOCK();
              *piVar1 = *piVar1 + -1;
              UNLOCK();
              if (*piVar1 == 0) {
                if (local_1d8.allocator == (Allocator *)0x0) {
                  if (local_1d8.data != (void *)0x0) {
                    local_250 = (Mat *)CONCAT44(local_250._4_4_,local_238.d);
                    local_254 = local_238.elempack;
                    local_190 = local_238.allocator;
                    local_188 = lVar11;
                    free(local_1d8.data);
                    iVar8 = (int)local_188;
                    pAVar12 = local_190;
                    iVar6 = local_254;
                    iVar9 = (int)local_250;
                  }
                }
                else {
                  local_250 = (Mat *)CONCAT44(local_250._4_4_,local_238.d);
                  local_254 = local_238.elempack;
                  local_190 = local_238.allocator;
                  local_188 = lVar11;
                  (*(local_1d8.allocator)->_vptr_Allocator[3])
                            (local_1d8.allocator,local_1d8.data,uVar4 % uVar14);
                  pAVar12 = local_190;
                  iVar6 = local_254;
                  iVar8 = (int)local_188;
                  iVar9 = (int)local_250;
                }
              }
            }
            local_1d8.dims = iVar16 + -1;
            local_1d8.elemsize._0_4_ = uVar2;
            local_1d8.elemsize._4_4_ = uVar3;
            local_1d8.h = iVar13;
            local_1d8.d = 1;
            uVar14 = local_1e8;
            local_1d8.data = pvVar15;
            local_1d8.elempack = iVar6;
            local_1d8.allocator = pAVar12;
            local_1d8.w = iVar8;
            local_1d8.c = iVar9;
            local_1d8.cstep = uVar18;
          }
          local_1d8.refcount._4_4_ = 0;
          local_1d8.refcount._0_4_ = 0;
          if (0 < (int)uVar14) {
            iVar16 = 0;
            do {
              iVar13 = (int)uVar14 - iVar16;
              if (TILE_N < iVar13) {
                iVar13 = TILE_N;
              }
              local_250 = local_128;
              if (local_264 == 3) {
                pack_A_tile(local_128,&local_1d8,(int)local_248,(int)local_260,iVar16,iVar13);
                local_250 = &local_1d8;
              }
              if (0 < iVar5) {
                iVar6 = 0;
                do {
                  iVar9 = TILE_K;
                  iVar8 = iVar5 - iVar6;
                  if (TILE_K < iVar5 - iVar6) {
                    iVar8 = TILE_K;
                  }
                  iVar10 = get_omp_thread_num();
                  local_c8.cstep = (size_t)local_118.w;
                  local_78.cstep = (size_t)local_178.w;
                  local_c8.data =
                       (void *)((long)local_118.data +
                               CONCAT44(local_118.elemsize._4_4_,(undefined4)local_118.elemsize) *
                               local_c8.cstep * (long)(iVar6 / iVar9) +
                               (long)iVar10 * local_118.cstep *
                               CONCAT44(local_118.elemsize._4_4_,(undefined4)local_118.elemsize));
                  local_78.data =
                       (void *)((long)local_178.data +
                               CONCAT44(local_178.elemsize._4_4_,(undefined4)local_178.elemsize) *
                               local_78.cstep * (long)(iVar6 / TILE_K) +
                               (long)(iVar16 / TILE_N) * local_178.cstep *
                               CONCAT44(local_178.elemsize._4_4_,(undefined4)local_178.elemsize));
                  local_c8.refcount._0_4_ = 0;
                  local_c8.refcount._4_4_ = 0;
                  local_c8.elemsize._0_4_ = (undefined4)local_118.elemsize;
                  local_c8.elemsize._4_4_ = local_118.elemsize._4_4_;
                  local_c8.elempack = local_118.elempack;
                  local_c8.allocator = local_118.allocator;
                  local_c8.w = local_118.w;
                  local_c8.dims = 2;
                  local_c8.h = 1;
                  local_c8.d = 1;
                  local_c8.c = 1;
                  local_78.refcount._0_4_ = 0;
                  local_78.refcount._4_4_ = 0;
                  local_78.elemsize._0_4_ = (undefined4)local_178.elemsize;
                  local_78.elemsize._4_4_ = local_178.elemsize._4_4_;
                  local_78.elempack = local_178.elempack;
                  local_78.allocator = local_178.allocator;
                  local_78.w = local_178.w;
                  local_78.dims = 2;
                  local_78.h = 1;
                  local_78.d = 1;
                  local_78.c = 1;
                  if (iVar16 == 0) {
                    if (local_268 == 0) {
                      pack_A_tile(local_1e0,&local_c8,(int)local_248,(int)local_260,iVar6,iVar8);
                    }
                    else {
                      transpose_pack_A_tile
                                (local_1e0,&local_c8,(int)local_248,(int)local_260,iVar6,iVar8);
                    }
                  }
                  gemm_transB_packed_tile
                            (&local_c8,&local_78,local_250,&local_1d8,local_120,local_264,
                             (int)local_248,(int)local_260,iVar16,iVar13,iVar6,iVar8,
                             (bool)(iVar5 <= TILE_K + iVar6 & local_26d));
                  piVar1 = (int *)CONCAT44(local_78.refcount._4_4_,local_78.refcount._0_4_);
                  if (piVar1 != (int *)0x0) {
                    LOCK();
                    *piVar1 = *piVar1 + -1;
                    UNLOCK();
                    if (*piVar1 == 0) {
                      if (local_78.allocator == (Allocator *)0x0) {
                        if (local_78.data != (void *)0x0) {
                          free(local_78.data);
                        }
                      }
                      else {
                        (*(local_78.allocator)->_vptr_Allocator[3])();
                      }
                    }
                  }
                  local_78.cstep = 0;
                  local_78.data = (void *)0x0;
                  local_78.refcount._0_4_ = 0;
                  local_78.refcount._4_4_ = 0;
                  local_78.elemsize._0_4_ = 0;
                  local_78.elemsize._4_4_ = 0;
                  local_78.elempack = 0;
                  local_78.dims = 0;
                  local_78.w = 0;
                  local_78.h = 0;
                  local_78.d = 0;
                  local_78.c = 0;
                  piVar1 = (int *)CONCAT44(local_c8.refcount._4_4_,local_c8.refcount._0_4_);
                  if (piVar1 != (int *)0x0) {
                    LOCK();
                    *piVar1 = *piVar1 + -1;
                    UNLOCK();
                    if (*piVar1 == 0) {
                      if (local_c8.allocator == (Allocator *)0x0) {
                        if (local_c8.data != (void *)0x0) {
                          free(local_c8.data);
                        }
                      }
                      else {
                        (*(local_c8.allocator)->_vptr_Allocator[3])();
                      }
                    }
                  }
                  local_c8.cstep = 0;
                  local_c8.data = (void *)0x0;
                  local_c8.refcount._0_4_ = 0;
                  local_c8.refcount._4_4_ = 0;
                  local_c8.elemsize._0_4_ = 0;
                  local_c8.elemsize._4_4_ = 0;
                  local_c8.elempack = 0;
                  local_c8.dims = 0;
                  local_c8.w = 0;
                  local_c8.h = 0;
                  local_c8.d = 0;
                  local_c8.c = 0;
                  iVar6 = iVar6 + TILE_K;
                } while (iVar6 < iVar5);
              }
              if (output_transpose != 0) {
                transpose_unpack_output_tile
                          (&local_1d8,local_120,(int)local_248,(int)local_260,iVar16,iVar13);
              }
              iVar16 = iVar16 + TILE_N;
              uVar14 = local_1e8;
            } while (iVar16 < (int)local_1e8);
          }
          iVar16 = local_17c;
          pMVar17 = local_1e0;
          piVar1 = (int *)CONCAT44(local_1d8.refcount._4_4_,local_1d8.refcount._0_4_);
          if (piVar1 != (int *)0x0) {
            LOCK();
            *piVar1 = *piVar1 + -1;
            UNLOCK();
            if (*piVar1 == 0) {
              if (local_1d8.allocator == (Allocator *)0x0) {
                if (local_1d8.data != (void *)0x0) {
                  free(local_1d8.data);
                }
              }
              else {
                (*(local_1d8.allocator)->_vptr_Allocator[3])();
              }
            }
          }
          local_1d8.cstep = 0;
          local_1d8.data = (void *)0x0;
          local_1d8.refcount._0_4_ = 0;
          local_1d8.refcount._4_4_ = 0;
          local_1d8.elemsize._0_4_ = 0;
          local_1d8.elemsize._4_4_ = 0;
          local_1d8.elempack = 0;
          local_1d8.dims = 0;
          local_1d8.w = 0;
          local_1d8.h = 0;
          local_1d8.d = 0;
          local_1d8.c = 0;
          iVar16 = iVar16 + 1;
        } while (iVar16 != local_240);
      }
      iVar16 = 0;
    }
    else {
      Mat::create(&local_238,TILE_M * TILE_N,1,nT,4,opt->workspace_allocator);
      iVar16 = -100;
      if ((local_238.data != (void *)0x0) && ((long)local_238.c * local_238.cstep != 0))
      goto LAB_0051b0fd;
    }
    piVar1 = (int *)CONCAT44(local_238.refcount._4_4_,local_238.refcount._0_4_);
    if (piVar1 != (int *)0x0) {
      LOCK();
      *piVar1 = *piVar1 + -1;
      UNLOCK();
      if (*piVar1 == 0) {
        if (local_238.allocator == (Allocator *)0x0) {
          if (local_238.data != (void *)0x0) {
            free(local_238.data);
          }
        }
        else {
          (*(local_238.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    local_238.cstep = 0;
    local_238.data = (void *)0x0;
    local_238.refcount._0_4_ = 0;
    local_238.refcount._4_4_ = 0;
    local_238.elemsize._0_4_ = 0;
    local_238.elemsize._4_4_ = 0;
    local_238.elempack = 0;
    local_238.dims = 0;
    local_238.w = 0;
    local_238.h = 0;
    local_238.d = 0;
    local_238.c = 0;
  }
  piVar1 = (int *)CONCAT44(local_178.refcount._4_4_,local_178.refcount._0_4_);
  if (piVar1 != (int *)0x0) {
    LOCK();
    *piVar1 = *piVar1 + -1;
    UNLOCK();
    if (*piVar1 == 0) {
      if (local_178.allocator == (Allocator *)0x0) {
        if (local_178.data != (void *)0x0) {
          free(local_178.data);
        }
      }
      else {
        (*(local_178.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  local_178.cstep = 0;
  local_178.data = (void *)0x0;
  local_178.refcount._0_4_ = 0;
  local_178.refcount._4_4_ = 0;
  local_178.elemsize._0_4_ = 0;
  local_178.elemsize._4_4_ = 0;
  local_178.elempack = 0;
  local_178.dims = 0;
  local_178.w = 0;
  local_178.h = 0;
  local_178.d = 0;
  local_178.c = 0;
LAB_0051b8aa:
  piVar1 = (int *)CONCAT44(local_118.refcount._4_4_,local_118.refcount._0_4_);
  if (piVar1 != (int *)0x0) {
    LOCK();
    *piVar1 = *piVar1 + -1;
    UNLOCK();
    if (*piVar1 == 0) {
      if (local_118.allocator == (Allocator *)0x0) {
        if (local_118.data != (void *)0x0) {
          free(local_118.data);
        }
      }
      else {
        (*(local_118.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar16;
}

Assistant:

static int gemm_x86(const Mat& A, const Mat& B, const Mat& C, Mat& top_blob, int broadcast_type_C, int transA, int transB, int output_transpose, int constant_TILE_M, int constant_TILE_N, int constant_TILE_K, int nT, const Option& opt)
{
    const int M = transA ? A.w : (A.dims == 3 ? A.c : A.h) * A.elempack;
    const int K = transA ? (A.dims == 3 ? A.c : A.h) * A.elempack : A.w;
    const int N = transB ? (B.dims == 3 ? B.c : B.h) * B.elempack : B.w;

    // NCNN_LOGE("M/N/K = %d %d %d", M, N, K);

    int TILE_M, TILE_N, TILE_K;
    get_optimal_tile_mnk(M, N, K, constant_TILE_M, constant_TILE_N, constant_TILE_K, TILE_M, TILE_N, TILE_K, nT);

    // NCNN_LOGE("TILE M/N/K = %d %d %d", TILE_M, TILE_N, TILE_K);

    int nn_M = (M + TILE_M - 1) / TILE_M;
    int nn_N = (N + TILE_N - 1) / TILE_N;
    int nn_K = (K + TILE_K - 1) / TILE_K;

    Mat ATX(TILE_K * TILE_M, (K + TILE_K - 1) / TILE_K, nT, 4u, opt.workspace_allocator);
    if (ATX.empty())
        return -100;
    Mat BT(TILE_K * TILE_N, (K + TILE_K - 1) / TILE_K, (N + TILE_N - 1) / TILE_N, 4u, opt.workspace_allocator);
    if (BT.empty())
        return -100;

    const int nn_NK = nn_N * nn_K;

    // pack B
    #pragma omp parallel for num_threads(nT)
    for (int ppjk = 0; ppjk < nn_NK; ppjk++)
    {
        const int ppj = ppjk / nn_K;
        const int ppk = ppjk % nn_K;

        const int j = ppj * TILE_N;
        const int k = ppk * TILE_K;

        const int max_jj = std::min((N - j), TILE_N);
        const int max_kk = std::min((K - k), TILE_K);

        Mat BT_tile = BT.channel(j / TILE_N).row_range(k / TILE_K, 1);

        if (transB)
        {
            pack_B_tile(B, BT_tile, j, max_jj, k, max_kk);
        }
        else
        {
            transpose_pack_B_tile(B, BT_tile, j, max_jj, k, max_kk);
        }
    }

    Mat topT;
    if (K > TILE_K || broadcast_type_C == 3 || output_transpose)
    {
        topT.create(TILE_N * TILE_M, 1, nT, 4u, opt.workspace_allocator);
        if (topT.empty())
            return -100;
    }

    #pragma omp parallel for num_threads(nT)
    for (int ppi = 0; ppi < nn_M; ppi++)
    {
        const int i = ppi * TILE_M;

        // shadowed variable for less openmp task args
        const int M = transA ? A.w : (A.dims == 3 ? A.c : A.h) * A.elempack;
        const int K = transA ? (A.dims == 3 ? A.c : A.h) * A.elempack : A.w;

        const int max_ii = std::min((M - i), TILE_M);

        Mat topT_tile;
        if (K > TILE_K || broadcast_type_C == 3 || output_transpose)
            topT_tile = topT.channel(get_omp_thread_num());

        for (int j = 0; j < N; j += TILE_N)
        {
            const int max_jj = std::min((N - j), TILE_N);

            if (broadcast_type_C == 3)
            {
                pack_A_tile(C, topT_tile, i, max_ii, j, max_jj);
            }

            const Mat& CT_tile = broadcast_type_C == 3 ? topT_tile : C;

            for (int k = 0; k < K; k += TILE_K)
            {
                const int max_kk = std::min((K - k), TILE_K);

                // NCNN_LOGE("max_ii/jj/kk = %d %d %d", max_ii, max_jj, max_kk);

                Mat AT_tile = ATX.channel(get_omp_thread_num()).row_range(k / TILE_K, 1);

                Mat BT_tile = BT.channel(j / TILE_N).row_range(k / TILE_K, 1);

                if (j == 0)
                {
                    if (transA)
                    {
                        transpose_pack_A_tile(A, AT_tile, i, max_ii, k, max_kk);
                    }
                    else
                    {
                        pack_A_tile(A, AT_tile, i, max_ii, k, max_kk);
                    }
                }

                bool k_end = !output_transpose && k + TILE_K >= K;

                gemm_transB_packed_tile(AT_tile, BT_tile, CT_tile, topT_tile, top_blob, broadcast_type_C, i, max_ii, j, max_jj, k, max_kk, k_end);
            }

            if (output_transpose)
            {
                transpose_unpack_output_tile(topT_tile, top_blob, i, max_ii, j, max_jj);
            }
        }
    }

    return 0;
}